

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O1

void dequeue_all(repl_p_head *head)

{
  repl_p_entry *prVar1;
  repl_p_entry **pprVar2;
  repl_p_entry *prVar3;
  int iVar4;
  
  iVar4 = 0x1000;
  do {
    prVar3 = (repl_p_entry *)ringbuf_trydequeue_s(head->ringbuf,0x20);
    if (prVar3 == (repl_p_entry *)0x0) {
      return;
    }
    prVar1 = (prVar3->node).tqe_next;
    if (prVar1 != (repl_p_entry *)0x0) {
      (prVar1->node).tqe_prev = (prVar3->node).tqe_prev;
      *(prVar3->node).tqe_prev = prVar1;
      (prVar3->node).tqe_next = (repl_p_entry *)0x0;
      pprVar2 = (head->first).tqh_last;
      (prVar3->node).tqe_prev = pprVar2;
      *pprVar2 = prVar3;
      (head->first).tqh_last = (repl_p_entry **)prVar3;
    }
    *prVar3->ptr_entry = prVar3;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

static void
dequeue_all(struct repl_p_head *head)
{
	struct repl_p_entry *e;
	int counter = 0;

	do {
		e = ringbuf_trydequeue_s(head->ringbuf,
						sizeof(struct repl_p_entry));
		if (e == NULL)
			break;

		TAILQ_MOVE_TO_TAIL(&head->first, e, node);

		/* unlock the entry, so that it can be used again */
		util_atomic_store_explicit64(e->ptr_entry, e,
						memory_order_relaxed);
		/*
		 * We are limiting the number of iterations,
		 * so that this loop ends for sure, because other thread
		 * can insert new elements to the ring buffer in the same time.
		 */
	} while (++counter < LEN_RING_BUF);
}